

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead_branch_elim_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::DeadBranchElimPass::EraseDeadBlocks
          (DeadBranchElimPass *this,Function *func,
          unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
          *live_blocks,
          unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
          *unreachable_merges,
          unordered_map<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>_>_>
          *unreachable_continues)

{
  IntrusiveNodeBase<spvtools::opt::Instruction> *pIVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  size_type sVar4;
  const_iterator cVar5;
  Instruction *pIVar6;
  DefUseManager *this_00;
  size_type sVar7;
  Function *pFVar8;
  BasicBlock *pBVar9;
  bool bVar10;
  IRContext *pIVar11;
  type tVar12;
  initializer_list<unsigned_int> init_list;
  type local_f8;
  Op local_e4;
  IntrusiveNodeBase<spvtools::opt::Instruction> *local_e0;
  IntrusiveNodeBase<spvtools::opt::Instruction> *local_d8;
  IRContext *local_d0;
  uint32_t local_c4 [3];
  initializer_list<spvtools::opt::Operand> local_b8;
  Function *local_a8;
  SmallVector<unsigned_int,_2UL> SStack_a0;
  _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_78;
  IRContext *local_70;
  Function *local_68;
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  *local_60;
  SmallVector<unsigned_int,_2UL> local_58;
  
  local_f8.container_ = &func->blocks_;
  tVar12.iterator_._M_current =
       (func->blocks_).
       super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  tVar12.container_ = local_f8.container_;
  bVar10 = false;
  local_78 = &live_blocks->_M_h;
  local_70 = (IRContext *)unreachable_merges;
  local_68 = func;
  local_60 = local_f8.container_;
  do {
    if ((local_f8.container_ == local_60) &&
       (tVar12.iterator_._M_current._M_current ==
        (local_68->blocks_).
        super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      return bVar10;
    }
    local_a8 = (Function *)
               ((tVar12.iterator_._M_current._M_current)->_M_t).
               super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
               .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
    local_f8 = tVar12;
    sVar4 = std::
            _Hashtable<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::count(&unreachable_continues->_M_h,(key_type *)&local_a8);
    if (sVar4 == 0) {
      local_a8 = (Function *)
                 ((local_f8.iterator_._M_current)->_M_t).
                 super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                 .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
      sVar7 = std::
              _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count((_Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)local_70,(key_type *)&local_a8);
      if (sVar7 != 0) {
        pFVar8 = *(Function **)
                  ((long)&((((local_f8.iterator_._M_current)->_M_t).
                            super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                            .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl)
                          ->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
        BasicBlock::tail((BasicBlock *)&local_a8);
        if (pFVar8 == local_a8) {
          pIVar6 = BasicBlock::terminator
                             (((local_f8.iterator_._M_current)->_M_t).
                              super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                              .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>.
                              _M_head_impl);
          if (pIVar6->opcode_ == OpUnreachable) goto LAB_004a3412;
        }
        MemPass::KillAllInsts
                  (&this->super_MemPass,
                   ((local_f8.iterator_._M_current)->_M_t).
                   super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                   .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl,false);
        pBVar9 = ((local_f8.iterator_._M_current)->_M_t).
                 super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                 .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
        local_58._vptr_SmallVector = (_func_int **)(this->super_MemPass).super_Pass.context_;
        local_b8._M_array = (iterator)CONCAT44(local_b8._M_array._4_4_,0xff);
        local_d0 = (IRContext *)((ulong)local_d0 & 0xffffffff00000000);
        local_e4 = OpNop;
        local_a8 = (Function *)0x0;
        SStack_a0._vptr_SmallVector = (_func_int **)0x0;
        MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,int,std::initializer_list<spvtools::opt::Operand>>
                  ((spvtools *)&local_e0,(IRContext **)&local_58,(Op *)&local_b8,(int *)&local_d0,
                   (int *)&local_e4,(initializer_list<spvtools::opt::Operand> *)&local_a8);
        pIVar1 = local_e0;
        local_e0 = (IntrusiveNodeBase<spvtools::opt::Instruction> *)0x0;
        utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore
                  (pIVar1,(Instruction *)
                          ((long)&(pBVar9->insts_).super_IntrusiveList<spvtools::opt::Instruction> +
                          8));
        if (local_e0 != (IntrusiveNodeBase<spvtools::opt::Instruction> *)0x0) {
          (**(code **)(*(long *)local_e0 + 8))();
        }
        local_e0 = (IntrusiveNodeBase<spvtools::opt::Instruction> *)0x0;
        pIVar11 = (this->super_MemPass).super_Pass.context_;
        pIVar6 = BasicBlock::terminator
                           (((local_f8.iterator_._M_current)->_M_t).
                            super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                            .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl)
        ;
        IRContext::AnalyzeUses(pIVar11,pIVar6);
        pIVar11 = (this->super_MemPass).super_Pass.context_;
        pFVar8 = (Function *)
                 BasicBlock::terminator
                           (((local_f8.iterator_._M_current)->_M_t).
                            super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                            .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl)
        ;
        pBVar9 = ((local_f8.iterator_._M_current)->_M_t).
                 super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                 .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
        goto LAB_004a3405;
      }
      local_a8 = (Function *)
                 ((local_f8.iterator_._M_current)->_M_t).
                 super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                 .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
      sVar7 = std::
              _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(local_78,(key_type *)&local_a8);
      if (sVar7 != 0) goto LAB_004a3412;
      MemPass::KillAllInsts
                (&this->super_MemPass,
                 ((local_f8.iterator_._M_current)->_M_t).
                 super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                 .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl,true);
      tVar12 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::Erase<false>(&local_f8);
      bVar10 = true;
    }
    else {
      local_a8 = (Function *)
                 ((local_f8.iterator_._M_current)->_M_t).
                 super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                 .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
      cVar5 = std::
              _Hashtable<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&unreachable_continues->_M_h,(key_type *)&local_a8);
      uVar2 = BasicBlock::id(*(BasicBlock **)
                              ((long)cVar5.
                                     super__Node_iterator_base<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>,_false>
                                     ._M_cur + 0x10));
      pFVar8 = *(Function **)
                ((long)&((((local_f8.iterator_._M_current)->_M_t).
                          super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                          .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl)->
                        insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
      BasicBlock::tail((BasicBlock *)&local_a8);
      if (pFVar8 == local_a8) {
        pIVar6 = BasicBlock::terminator
                           (((local_f8.iterator_._M_current)->_M_t).
                            super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                            .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl)
        ;
        if (pIVar6->opcode_ == OpBranch) {
          pIVar6 = BasicBlock::terminator
                             (((local_f8.iterator_._M_current)->_M_t).
                              super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                              .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>.
                              _M_head_impl);
          uVar3 = Instruction::GetSingleWordInOperand(pIVar6,0);
          if (uVar3 == uVar2) goto LAB_004a3412;
        }
      }
      MemPass::KillAllInsts
                (&this->super_MemPass,
                 ((local_f8.iterator_._M_current)->_M_t).
                 super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                 .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl,false);
      local_a8 = (Function *)
                 ((local_f8.iterator_._M_current)->_M_t).
                 super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                 .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
      sVar4 = std::
              _Hashtable<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::count(&unreachable_continues->_M_h,(key_type *)&local_a8);
      if (sVar4 == 0) {
        __assert_fail("unreachable_continues.count(&*ebi)",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/dead_branch_elim_pass.cpp"
                      ,0x17e,
                      "bool spvtools::opt::DeadBranchElimPass::EraseDeadBlocks(Function *, const std::unordered_set<BasicBlock *> &, const std::unordered_set<BasicBlock *> &, const std::unordered_map<BasicBlock *, BasicBlock *> &)"
                     );
      }
      pBVar9 = ((local_f8.iterator_._M_current)->_M_t).
               super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
               .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
      local_d0 = (this->super_MemPass).super_Pass.context_;
      local_e4 = OpBranch;
      local_c4[2] = 0;
      local_c4[1] = 0;
      init_list._M_len = 1;
      init_list._M_array = local_c4;
      local_c4[0] = uVar2;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list);
      local_a8 = (Function *)CONCAT44(local_a8._4_4_,1);
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&SStack_a0,&local_58);
      local_b8._M_len = 1;
      local_b8._M_array = (iterator)&local_a8;
      MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,int,std::initializer_list<spvtools::opt::Operand>>
                ((spvtools *)&local_d8,&local_d0,&local_e4,(int *)(local_c4 + 2),
                 (int *)(local_c4 + 1),&local_b8);
      pIVar1 = local_d8;
      local_d8 = (IntrusiveNodeBase<spvtools::opt::Instruction> *)0x0;
      utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore
                (pIVar1,(Instruction *)
                        ((long)&(pBVar9->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 8
                        ));
      if (local_d8 != (IntrusiveNodeBase<spvtools::opt::Instruction> *)0x0) {
        (**(code **)(*(long *)local_d8 + 8))();
      }
      local_d8 = (IntrusiveNodeBase<spvtools::opt::Instruction> *)0x0;
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&SStack_a0);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
      this_00 = Pass::get_def_use_mgr((Pass *)this);
      BasicBlock::tail((BasicBlock *)&local_a8);
      analysis::DefUseManager::AnalyzeInstUse(this_00,(Instruction *)local_a8);
      pIVar11 = (this->super_MemPass).super_Pass.context_;
      BasicBlock::tail((BasicBlock *)&local_a8);
      pBVar9 = ((local_f8.iterator_._M_current)->_M_t).
               super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
               .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
      pFVar8 = local_a8;
LAB_004a3405:
      IRContext::set_instr_block(pIVar11,(Instruction *)pFVar8,pBVar9);
      bVar10 = true;
LAB_004a3412:
      tVar12.iterator_._M_current = local_f8.iterator_._M_current._M_current + 1;
      tVar12.container_ = local_f8.container_;
    }
    local_f8.container_ = tVar12.container_;
  } while( true );
}

Assistant:

bool DeadBranchElimPass::EraseDeadBlocks(
    Function* func, const std::unordered_set<BasicBlock*>& live_blocks,
    const std::unordered_set<BasicBlock*>& unreachable_merges,
    const std::unordered_map<BasicBlock*, BasicBlock*>& unreachable_continues) {
  bool modified = false;
  for (auto ebi = func->begin(); ebi != func->end();) {
    if (unreachable_continues.count(&*ebi)) {
      uint32_t cont_id = unreachable_continues.find(&*ebi)->second->id();
      if (ebi->begin() != ebi->tail() ||
          ebi->terminator()->opcode() != spv::Op::OpBranch ||
          ebi->terminator()->GetSingleWordInOperand(0u) != cont_id) {
        // Make unreachable, but leave the label.
        KillAllInsts(&*ebi, false);
        // Add unconditional branch to header.
        assert(unreachable_continues.count(&*ebi));
        ebi->AddInstruction(MakeUnique<Instruction>(
            context(), spv::Op::OpBranch, 0, 0,
            std::initializer_list<Operand>{{SPV_OPERAND_TYPE_ID, {cont_id}}}));
        get_def_use_mgr()->AnalyzeInstUse(&*ebi->tail());
        context()->set_instr_block(&*ebi->tail(), &*ebi);
        modified = true;
      }
      ++ebi;
    } else if (unreachable_merges.count(&*ebi)) {
      if (ebi->begin() != ebi->tail() ||
          ebi->terminator()->opcode() != spv::Op::OpUnreachable) {
        // Make unreachable, but leave the label.
        KillAllInsts(&*ebi, false);
        // Add unreachable terminator.
        ebi->AddInstruction(
            MakeUnique<Instruction>(context(), spv::Op::OpUnreachable, 0, 0,
                                    std::initializer_list<Operand>{}));
        context()->AnalyzeUses(ebi->terminator());
        context()->set_instr_block(ebi->terminator(), &*ebi);
        modified = true;
      }
      ++ebi;
    } else if (!live_blocks.count(&*ebi)) {
      // Kill this block.
      KillAllInsts(&*ebi);
      ebi = ebi.Erase();
      modified = true;
    } else {
      ++ebi;
    }
  }

  return modified;
}